

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camgeom.cc
# Opt level: O0

void gmath::refineOptimal(Matrix33d *F,Vector3d *p0,Vector3d *p1)

{
  value_type vVar1;
  double dVar2;
  double *pdVar3;
  size_type sVar4;
  reference pvVar5;
  SVector<double,_3> *in_RDX;
  SVector<double,_3> *in_RSI;
  SMatrix<double,_3,_3> *u;
  Polynomiald *p_00;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double s;
  size_t i;
  double mins;
  double t;
  vector<double,_std::allocator<double>_> r;
  Polynomiald p;
  double d2;
  double c2;
  double b2;
  double a2;
  double g2;
  double f4;
  double f2;
  double d;
  double c;
  double b;
  double a;
  double g;
  double f;
  Matrix33d R1;
  Matrix33d R0;
  Vector3d e1;
  Vector3d e0;
  Vector3d W;
  Matrix33d V;
  Matrix33d U;
  Matrix33d F2;
  Matrix33d invT1;
  Matrix33d invT0;
  Polynomial<double> *in_stack_fffffffffffff770;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff780;
  SMatrix<double,_3,_3> *in_stack_fffffffffffff788;
  Polynomial<double> *in_stack_fffffffffffff790;
  SMatrix<double,_3,_3> *in_stack_fffffffffffff798;
  SMatrix<double,_3,_3> *in_stack_fffffffffffff8a8;
  ulong uVar12;
  SVector<double,_3> *w;
  SMatrix<double,_3,_3> *a_00;
  SVector<double,_3> local_540 [7];
  SVector<double,_3> local_498;
  double local_480;
  ulong local_478;
  double local_470;
  value_type local_468;
  vector<double,_std::allocator<double>_> local_460 [2];
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  SMatrix<double,_3,_3> local_330;
  SMatrix<double,_3,_3> local_2e8;
  SMatrix<double,_3,_3> local_2a0;
  SVector<double,_3> local_258;
  SVector<double,_3> local_240;
  SVector<double,_3> local_228;
  SMatrix<double,_3,_3> local_210;
  SMatrix<double,_3,_3> local_1c8 [3];
  SMatrix<double,_3,_3> local_f0;
  SMatrix<double,_3,_3> local_a8;
  SMatrix<double,_3,_3> local_60;
  SVector<double,_3> *local_18;
  SVector<double,_3> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  SMatrix<double,_3,_3>::SMatrix(&local_60);
  SMatrix<double,_3,_3>::SMatrix(&local_a8);
  pdVar3 = SVector<double,_3>::operator[](local_10,0);
  w = (SVector<double,_3> *)*pdVar3;
  pdVar3 = SVector<double,_3>::operator[](local_10,2);
  u = (SMatrix<double,_3,_3> *)((double)w / *pdVar3);
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_60,0,2);
  *pdVar3 = (double)u;
  pdVar3 = SVector<double,_3>::operator[](local_10,1);
  a_00 = (SMatrix<double,_3,_3> *)*pdVar3;
  pdVar3 = SVector<double,_3>::operator[](local_10,2);
  p_00 = (Polynomiald *)((double)a_00 / *pdVar3);
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_60,1,2);
  *pdVar3 = (double)p_00;
  pdVar3 = SVector<double,_3>::operator[](local_18,0);
  dVar6 = *pdVar3;
  pdVar3 = SVector<double,_3>::operator[](local_18,2);
  dVar11 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_a8,0,2);
  *pdVar3 = dVar6 / dVar11;
  pdVar3 = SVector<double,_3>::operator[](local_18,1);
  dVar6 = *pdVar3;
  pdVar3 = SVector<double,_3>::operator[](local_18,2);
  dVar11 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_a8,1,2);
  *pdVar3 = dVar6 / dVar11;
  transpose<double,3,3>(in_stack_fffffffffffff788);
  operator*(in_stack_fffffffffffff798,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff790);
  operator*(in_stack_fffffffffffff798,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff790);
  SMatrix<double,_3,_3>::SMatrix(local_1c8);
  SMatrix<double,_3,_3>::SMatrix(&local_210);
  SVector<double,_3>::SVector(&local_228);
  svd<double,3,3>(a_00,u,w,in_stack_fffffffffffff8a8);
  SMatrix<double,_3,_3>::getColumn
            (in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20));
  SMatrix<double,_3,_3>::getColumn
            (in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20));
  pdVar3 = SVector<double,_3>::operator[](&local_240,0);
  dVar6 = *pdVar3;
  pdVar3 = SVector<double,_3>::operator[](&local_240,0);
  dVar11 = *pdVar3;
  pdVar3 = SVector<double,_3>::operator[](&local_240,1);
  dVar7 = *pdVar3;
  pdVar3 = SVector<double,_3>::operator[](&local_240,1);
  dVar6 = sqrt(dVar6 * dVar11 + dVar7 * *pdVar3);
  SVector<double,_3>::operator/=(&local_240,dVar6);
  pdVar3 = SVector<double,_3>::operator[](&local_258,0);
  dVar6 = *pdVar3;
  pdVar3 = SVector<double,_3>::operator[](&local_258,0);
  dVar11 = *pdVar3;
  pdVar3 = SVector<double,_3>::operator[](&local_258,1);
  dVar7 = *pdVar3;
  pdVar3 = SVector<double,_3>::operator[](&local_258,1);
  dVar6 = sqrt(dVar6 * dVar11 + dVar7 * *pdVar3);
  SVector<double,_3>::operator/=(&local_258,dVar6);
  SMatrix<double,_3,_3>::SMatrix(&local_2a0);
  pdVar3 = SVector<double,_3>::operator[](&local_240,0);
  dVar6 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2a0,0,0);
  *pdVar3 = dVar6;
  pdVar3 = SVector<double,_3>::operator[](&local_240,1);
  dVar6 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2a0,0,1);
  *pdVar3 = dVar6;
  pdVar3 = SVector<double,_3>::operator[](&local_240,1);
  dVar6 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2a0,1,0);
  *pdVar3 = -dVar6;
  pdVar3 = SVector<double,_3>::operator[](&local_240,0);
  dVar6 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2a0,1,1);
  *pdVar3 = dVar6;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2a0,2,2);
  *pdVar3 = 1.0;
  SMatrix<double,_3,_3>::SMatrix(&local_2e8);
  pdVar3 = SVector<double,_3>::operator[](&local_258,0);
  dVar6 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2e8,0,0);
  *pdVar3 = dVar6;
  pdVar3 = SVector<double,_3>::operator[](&local_258,1);
  dVar6 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2e8,0,1);
  *pdVar3 = dVar6;
  pdVar3 = SVector<double,_3>::operator[](&local_258,1);
  dVar6 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2e8,1,0);
  *pdVar3 = -dVar6;
  pdVar3 = SVector<double,_3>::operator[](&local_258,0);
  dVar6 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2e8,1,1);
  *pdVar3 = dVar6;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_2e8,2,2);
  *pdVar3 = 1.0;
  operator*(in_stack_fffffffffffff798,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff790);
  transpose<double,3,3>(in_stack_fffffffffffff788);
  operator*(in_stack_fffffffffffff798,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff790);
  SMatrix<double,_3,_3>::operator=(&local_f0,&local_330);
  pdVar3 = SVector<double,_3>::operator[](&local_240,2);
  local_3c8 = *pdVar3;
  pdVar3 = SVector<double,_3>::operator[](&local_258,2);
  local_3d0 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_f0,1,1);
  local_3d8 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_f0,1,2);
  local_3e0 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_f0,2,1);
  local_3e8 = *pdVar3;
  pdVar3 = SMatrix<double,_3,_3>::operator()(&local_f0,2,2);
  local_3f0 = *pdVar3;
  local_3f8 = local_3c8 * local_3c8;
  local_400 = local_3f8 * local_3f8;
  local_408 = local_3d0 * local_3d0;
  local_410 = local_3d8 * local_3d8;
  local_418 = local_3e0 * local_3e0;
  local_420 = local_3e8 * local_3e8;
  local_428 = local_3f0 * local_3f0;
  Polynomial<double>::Polynomial(in_stack_fffffffffffff770);
  Polynomial<double>::set
            (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (double)in_stack_fffffffffffff780);
  Polynomial<double>::set
            (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (double)in_stack_fffffffffffff780);
  Polynomial<double>::set
            (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (double)in_stack_fffffffffffff780);
  Polynomial<double>::set
            (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (double)in_stack_fffffffffffff780);
  Polynomial<double>::set
            (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (double)in_stack_fffffffffffff780);
  Polynomial<double>::set
            (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (double)in_stack_fffffffffffff780);
  Polynomial<double>::set
            (in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
             (double)in_stack_fffffffffffff780);
  realRoots(p_00);
  local_468 = std::numeric_limits<double>::max();
  local_470 = std::numeric_limits<double>::max();
  local_478 = 0;
  while (uVar12 = local_478, sVar4 = std::vector<double,_std::allocator<double>_>::size(local_460),
        dVar11 = local_3c8, dVar6 = local_3d8, uVar12 < sVar4) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
    dVar11 = local_3d8;
    dVar7 = dVar6 * *pvVar5 + local_3e0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
    dVar6 = local_3e8;
    dVar8 = dVar11 * *pvVar5 + local_3e0;
    dVar9 = local_3d0 * local_3d0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
    dVar11 = local_3e8;
    dVar6 = dVar6 * *pvVar5 + local_3f0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
    local_480 = dVar7 * dVar8 + dVar9 * dVar6 * (dVar11 * *pvVar5 + local_3f0);
    if ((local_480 != 0.0) || (NAN(local_480))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
      dVar6 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
      dVar11 = *pvVar5;
      dVar10 = local_3c8 * local_3c8;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
      dVar7 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
      dVar9 = local_3e8;
      dVar8 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
      dVar2 = local_3e8;
      dVar9 = dVar9 * *pvVar5 + local_3f0;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
      local_480 = (dVar6 * dVar11) / (dVar10 * dVar7 * dVar8 + 1.0) +
                  (dVar9 * (dVar2 * *pvVar5 + local_3f0)) / local_480;
      if (local_480 < local_470) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_460,local_478);
        local_468 = *pvVar5;
        local_470 = local_480;
      }
    }
    local_478 = local_478 + 1;
  }
  if (((local_3c8 * local_3c8 <= 0.0) ||
      (local_3d8 * local_3d8 + local_3d0 * local_3d0 * local_3e8 * local_3e8 <= 0.0)) ||
     (local_470 <=
      1.0 / (local_3c8 * local_3c8) +
      (local_3e8 * local_3e8) /
      (local_3d8 * local_3d8 + local_3d0 * local_3d0 * local_3e8 * local_3e8))) {
    dVar6 = local_468 * local_468 * local_3c8;
    pdVar3 = SVector<double,_3>::operator[](local_10,0);
    vVar1 = local_468;
    *pdVar3 = dVar6;
    pdVar3 = SVector<double,_3>::operator[](local_10,1);
    *pdVar3 = vVar1;
    dVar6 = local_468 * local_468 * local_3f8;
    pdVar3 = SVector<double,_3>::operator[](local_10,2);
    *pdVar3 = dVar6 + 1.0;
    dVar6 = local_3e8 * local_468 + local_3f0;
    in_stack_fffffffffffff790 = (Polynomial<double> *)(local_3d0 * dVar6 * dVar6);
    in_stack_fffffffffffff798 = (SMatrix<double,_3,_3> *)SVector<double,_3>::operator[](local_18,0);
    in_stack_fffffffffffff798->v[0][0] = (double)in_stack_fffffffffffff790;
    in_stack_fffffffffffff780 =
         (vector<double,_std::allocator<double>_> *)
         (-(local_3d8 * local_468 + local_3e0) * (local_3e8 * local_468 + local_3f0));
    in_stack_fffffffffffff788 = (SMatrix<double,_3,_3> *)SVector<double,_3>::operator[](local_18,1);
    in_stack_fffffffffffff788->v[0][0] = (double)in_stack_fffffffffffff780;
    dVar11 = local_3e8 * local_468 + local_3f0;
    dVar6 = local_3d8 * local_468 + local_3e0;
    in_stack_fffffffffffff770 = (Polynomial<double> *)(local_408 * dVar11 * dVar11 + dVar6 * dVar6);
    pdVar3 = SVector<double,_3>::operator[](local_18,2);
    *pdVar3 = (double)in_stack_fffffffffffff770;
  }
  else {
    pdVar3 = SVector<double,_3>::operator[](local_10,0);
    *pdVar3 = dVar11;
    pdVar3 = SVector<double,_3>::operator[](local_10,1);
    dVar6 = local_3f8;
    *pdVar3 = 0.0;
    pdVar3 = SVector<double,_3>::operator[](local_10,2);
    *pdVar3 = dVar6;
    dVar6 = local_3d0 * local_420;
    pdVar3 = SVector<double,_3>::operator[](local_18,0);
    *pdVar3 = dVar6;
    dVar6 = -local_3d8 * local_3e8;
    pdVar3 = SVector<double,_3>::operator[](local_18,1);
    *pdVar3 = dVar6;
    dVar6 = local_408 * local_420 + local_410;
    pdVar3 = SVector<double,_3>::operator[](local_18,2);
    *pdVar3 = dVar6;
  }
  transpose<double,3,3>(in_stack_fffffffffffff788);
  operator*(in_stack_fffffffffffff798,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff790);
  SMatrix<double,_3,_3>::operator*
            (in_stack_fffffffffffff798,(SVector<double,_3> *)in_stack_fffffffffffff790);
  SVector<double,_3>::operator=(local_10,&local_498);
  transpose<double,3,3>(in_stack_fffffffffffff788);
  operator*(in_stack_fffffffffffff798,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff790);
  SMatrix<double,_3,_3>::operator*
            (in_stack_fffffffffffff798,(SVector<double,_3> *)in_stack_fffffffffffff790);
  SVector<double,_3>::operator=(local_18,local_540);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff780);
  Polynomial<double>::~Polynomial(in_stack_fffffffffffff770);
  return;
}

Assistant:

void refineOptimal(const Matrix33d &F, Vector3d &p0, Vector3d &p1)
{
  // the implementation follows Hartley and Zisserman's (2003, pp. 318)

  Matrix33d invT0;
  Matrix33d invT1;
  invT0(0, 2)=p0[0]/p0[2];
  invT0(1, 2)=p0[1]/p0[2];
  invT1(0, 2)=p1[0]/p1[2];
  invT1(1, 2)=p1[1]/p1[2];

  // transform F

  Matrix33d F2=transpose(invT1)*F*invT0;

  // get epipoles of new fundamental matrix

  Matrix33d U, V;
  Vector3d W;
  svd(F2, U, W, V);
  Vector3d e0=V.getColumn(2);
  Vector3d e1=U.getColumn(2);

  // compute rotations

  e0/=sqrt(e0[0]*e0[0]+e0[1]*e0[1]);
  e1/=sqrt(e1[0]*e1[0]+e1[1]*e1[1]);
  Matrix33d R0;
  R0(0, 0)=e0[0];
  R0(0, 1)=e0[1];
  R0(1, 0)=-e0[1];
  R0(1, 1)=e0[0];
  R0(2, 2)=1;
  Matrix33d R1;
  R1(0, 0)=e1[0];
  R1(0, 1)=e1[1];
  R1(1, 0)=-e1[1];
  R1(1, 1)=e1[0];
  R1(2, 2)=1;

  // compute new F

  F2=R1*F2*transpose(R0);

  // compute coefficients of polynomial

  const double f=e0[2];
  const double g=e1[2];
  const double a=F2(1, 1);
  const double b=F2(1, 2);
  const double c=F2(2, 1);
  const double d=F2(2, 2);
  const double f2=f*f;
  const double f4=f2*f2;
  const double g2=g*g;
  const double a2=a*a;
  const double b2=b*b;
  const double c2=c*c;
  const double d2=d*d;

  Polynomiald p;
  p.set(0, b2*c*d-a*b*d2);
  p.set(1, b2*b2+b2*c2-a2*d2+2*b2*d2*g2+d2*d2*g2*g2);
  p.set(2, 4*a*b2*b+a*b*c2-a2*c*d+2*b2*c*d*f2-2*a*b*d2*f2+4*b2*c*d*g2+4*a*b*d2*g2
        +4*c*d2*d*g2*g2);
  p.set(3, 6*a2*b2+2*b2*c2*f2-2*a2*d2*f2+2*b2*c2*g2+8*a*b*c*d*g2+2*a2*d2*g2
        +6*c2*d2*g2*g2);
  p.set(4, 4*a2*a*b+2*a*b*c2*f2-2*a2*c*d*f2+b2*c*d*f4-a*b*d2*f4+4*a*b*c2*g2
        +4*a2*c*d*g2+4*c2*c*d*g2*g2);
  p.set(5, a2*a2+b2*c2*f4-a2*d2*f4+2*a2*c2*g2+c2*c2*g2*g2);
  p.set(6, a*b*c2*f4-a2*c*d*f4);

  // setting polynomial to 0 and get all real roots

  std::vector<double> r=realRoots(p);

  // find global minima (solution is t)

  double t=std::numeric_limits<double>::max();
  double mins=std::numeric_limits<double>::max();

  for (size_t i=0; i<r.size(); i++)
  {
    double s=(a*r[i]+b)*(a*r[i]+b)+g*g*(c*r[i]+d)*(c*r[i]+d);

    if (s != 0)
    {
      s=r[i]*r[i]/(1+f*f*r[i]*r[i])+(c*r[i]+d)*(c*r[i]+d)/s;

      if (s < mins)
      {
        t=r[i];
        mins=s;
      }
    }
  }

  // get optimal corner positions

  if (f*f > 0 && a*a+g*g*c*c > 0 && 1/(f*f)+c*c/(a*a+g*g*c*c) < mins)
  {
    p0[0]=f;
    p0[1]=0;
    p0[2]=f2;
    p1[0]=g*c2;
    p1[1]=-a*c;
    p1[2]=g2*c2+a2;
  }
  else
  {
    p0[0]=t*t*f;
    p0[1]=t;
    p0[2]=t*t*f2+1;
    p1[0]=g*(c*t+d)*(c*t+d);
    p1[1]=-(a*t+b)*(c*t+d);
    p1[2]=g2*(c*t+d)*(c*t+d)+(a*t+b)*(a*t+b);
  }

  // transform refined points back

  p0=invT0*transpose(R0)*p0;
  p1=invT1*transpose(R1)*p1;
}